

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_EnumReservedPositiveNumberOutOfRange_Test
::~ParseErrorTest_EnumReservedPositiveNumberOutOfRange_Test
          (ParseErrorTest_EnumReservedPositiveNumberOutOfRange_Test *this)

{
  ParseErrorTest_EnumReservedPositiveNumberOutOfRange_Test *this_local;
  
  ~ParseErrorTest_EnumReservedPositiveNumberOutOfRange_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseErrorTest, EnumReservedPositiveNumberOutOfRange) {
  ExpectHasErrors(
      "enum TestEnum {\n"
      "FOO = 1;\n"
      "  reserved 2147483648;\n"
      "}\n",
      "2:11: Integer out of range.\n");
}